

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# GlobOptFields.cpp
# Opt level: O0

void __thiscall
GlobOpt::KillLiveFields(GlobOpt *this,StackSym *stackSym,BVSparse<Memory::JitArenaAllocator> *bv)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  ObjectSymInfo *pOVar4;
  Loop *local_38;
  Loop *loop;
  PropertySym *propertySym;
  ObjectSymInfo *objectSymInfo;
  BVSparse<Memory::JitArenaAllocator> *bv_local;
  StackSym *stackSym_local;
  GlobOpt *this_local;
  
  bVar2 = StackSym::IsTypeSpec(stackSym);
  bv_local = (BVSparse<Memory::JitArenaAllocator> *)stackSym;
  if (bVar2) {
    bv_local = (BVSparse<Memory::JitArenaAllocator> *)StackSym::GetVarEquivSym(stackSym,this->func);
  }
  if (bv_local == (BVSparse<Memory::JitArenaAllocator> *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                       ,0x97,"(stackSym)","stackSym");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  bVar2 = StackSym::HasObjectInfo((StackSym *)bv_local);
  if ((bVar2) && (bVar2 = StackSym::IsSingleDef((StackSym *)bv_local), !bVar2)) {
    pOVar4 = StackSym::GetObjectInfo((StackSym *)bv_local);
    for (loop = (Loop *)pOVar4->m_propertySymList; loop != (Loop *)0x0;
        loop = (Loop *)(loop->blockList).allocator) {
      if ((BVSparse<Memory::JitArenaAllocator> *)
          (loop->blockList).super_SListBase<BasicBlock_*,_Memory::ArenaAllocator,_RealCount>.
          super_SListNodeBase<Memory::ArenaAllocator>.next != bv_local) {
        AssertCount = AssertCount + 1;
        Js::Throw::LogAssert();
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 1;
        bVar2 = Js::Throw::ReportAssert
                          ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/GlobOptFields.cpp"
                           ,0xa6,"(propertySym->m_stackSym == stackSym)",
                           "propertySym->m_stackSym == stackSym");
        if (!bVar2) {
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
        *puVar3 = 0;
      }
      BVSparse<Memory::JitArenaAllocator>::Clear(bv,*(BVIndex *)&loop->topFunc);
      bVar2 = IsLoopPrePass(this);
      if (bVar2) {
        for (local_38 = this->rootLoopPrePass; local_38 != (Loop *)0x0; local_38 = local_38->parent)
        {
          BVSparse<Memory::JitArenaAllocator>::Set(local_38->fieldKilled,*(BVIndex *)&loop->topFunc)
          ;
        }
      }
      else {
        bVar2 = BVSparse<Memory::JitArenaAllocator>::IsEmpty(bv);
        if (bVar2) break;
      }
    }
    KillObjectType(this,(StackSym *)bv_local,bv);
  }
  return;
}

Assistant:

void
GlobOpt::KillLiveFields(StackSym * stackSym, BVSparse<JitArenaAllocator> * bv)
{
    if (stackSym->IsTypeSpec())
    {
        stackSym = stackSym->GetVarEquivSym(this->func);
    }
    Assert(stackSym);

    // If the sym has no objectSymInfo, it must not represent an object and, hence, has no type sym or
    // property syms to kill.
    if (!stackSym->HasObjectInfo() || stackSym->IsSingleDef())
    {
        return;
    }

    // Note that the m_writeGuardSym is killed here as well, because it is part of the
    // m_propertySymList of the object.
    ObjectSymInfo * objectSymInfo = stackSym->GetObjectInfo();
    PropertySym * propertySym = objectSymInfo->m_propertySymList;
    while (propertySym != nullptr)
    {
        Assert(propertySym->m_stackSym == stackSym);
        bv->Clear(propertySym->m_id);
        if (this->IsLoopPrePass())
        {
            for (Loop * loop = this->rootLoopPrePass; loop != nullptr; loop = loop->parent)
            {
                loop->fieldKilled->Set(propertySym->m_id);
            }
        }
        else if (bv->IsEmpty())
        {
            // shortcut
            break;
        }
        propertySym = propertySym->m_nextInStackSymList;
    }

    this->KillObjectType(stackSym, bv);
}